

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O0

bool tinyusdz::isValidIdentifier(string *str,bool is_utf8)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ulong local_28;
  size_t i;
  bool is_utf8_local;
  string *str_local;
  
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    return false;
  }
  if (!is_utf8) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str);
    if ((((*pcVar3 < 'a') ||
         (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str), 'z' < *pcVar3)) &&
        ((pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str), *pcVar3 < 'A' ||
         (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str), 'Z' < *pcVar3)))) &&
       (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str), *pcVar3 != '_')) {
      return false;
    }
    local_28 = 1;
    while( true ) {
      uVar2 = ::std::__cxx11::string::length();
      if (uVar2 <= local_28) {
        return true;
      }
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str);
      if (((*pcVar3 < 'a') ||
          (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str), 'z' < *pcVar3)) &&
         (((pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str), *pcVar3 < 'A' ||
           (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str), 'Z' < *pcVar3)) &&
          (((pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str), *pcVar3 < '0' ||
            (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str), '9' < *pcVar3)) &&
           (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str), *pcVar3 != '_'))))))
      break;
      local_28 = local_28 + 1;
    }
    return false;
  }
  bVar1 = is_valid_utf8_identifier(str);
  return bVar1;
}

Assistant:

inline bool isValidIdentifier(const std::string &str, bool is_utf8 = true) {

  if (str.empty()) {
    return false;
  }

  if (is_utf8) {
    return is_valid_utf8_identifier(str);
  } else {
    // legacy
    
    // first char
    // [a-ZA-Z_]
    if ((('a' <= str[0]) && (str[0] <= 'z')) || (('A' <= str[0]) && (str[0] <= 'Z')) || (str[0] == '_')) {
      // ok
    } else {
      return false;
    }

    // remaining chars
    // [a-ZA-Z0-9_]
    for (size_t i = 1; i < str.length(); i++) {
      if ((('a' <= str[i]) && (str[i] <= 'z')) || (('A' <= str[i]) && (str[i] <= 'Z')) || (('0' <= str[i]) && (str[i] <= '9')) || (str[i] == '_')) {
        // ok
      } else {
        return false;
      }
    }
  }

  return true;
}